

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O0

void __thiscall SBmpFile::loadPixelData(SBmpFile *this,byte *buffer)

{
  size_t __n;
  size_t sVar1;
  int local_3c;
  int local_2c;
  int32_t fileY;
  int32_t y;
  size_t w;
  uint32_t offset;
  byte *buffer_local;
  SBmpFile *this_local;
  
  w._4_4_ = *(uint32_t *)(this->tempHeader + 10);
  if ((Options::IsBigEndian & 1) != 0) {
    w._4_4_ = sj_bswap32(w._4_4_);
  }
  __n = (size_t)this->width;
  for (local_2c = 0; local_2c < this->height; local_2c = local_2c + 1) {
    if ((this->upsideDown & 1U) == 0) {
      local_3c = local_2c;
    }
    else {
      local_3c = (this->height - local_2c) + -1;
    }
    fseek((FILE *)this->bmp,(ulong)w._4_4_ + __n * (long)local_3c,0);
    sVar1 = fread(buffer + __n * (long)local_2c,1,__n,(FILE *)this->bmp);
    if (__n != sVar1) {
      Error("[SAVENEX] reading BMP pixel data failed",(char *)0x0,FATAL);
    }
  }
  return;
}

Assistant:

void SBmpFile::loadPixelData(byte* buffer) {
	uint32_t offset = reinterpret_cast<SAlignSafeCast<uint32_t>*>(tempHeader + 10)->val;
	if (Options::IsBigEndian) offset = sj_bswap32(offset);
	const size_t w = static_cast<size_t>(width);
	for (int32_t y = 0; y < height; ++y) {
		const int32_t fileY = upsideDown ? (height - y - 1) : y;
		fseek(bmp, offset + (w * fileY), SEEK_SET);
		if (w != fread(buffer + (w * y), 1, w, bmp)) {
			Error("[SAVENEX] reading BMP pixel data failed", NULL, FATAL);
		}
	}
}